

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusreply.h
# Opt level: O0

QDBusReply<QVariant> * __thiscall
QDBusReply<QVariant>::operator=(QDBusReply<QVariant> *this,QDBusMessage *reply)

{
  QMetaType QVar1;
  QDBusMessage *in_RSI;
  QDBusReply<QVariant> *in_RDI;
  long in_FS_OFFSET;
  QVariant data;
  QDBusVariant *in_stack_ffffffffffffff58;
  QVariant *this_00;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar1 = QMetaType::fromType<QDBusVariant>();
  this_01 = &local_28;
  ::QVariant::QVariant((QVariant *)this_01,(QMetaType *)QVar1.d_ptr,(void *)0x0);
  qDBusReplyFill(in_RSI,&in_RDI->m_error,(QVariant *)this_01);
  qvariant_cast<QDBusVariant>((QVariant *)this_01);
  this_00 = &local_48;
  QDBusVariant::variant(in_stack_ffffffffffffff58);
  ::QVariant::operator=(this_00,(QVariant *)in_RDI);
  ::QVariant::~QVariant(this_00);
  QDBusVariant::~QDBusVariant((QDBusVariant *)0xae8496);
  ::QVariant::~QVariant((QVariant *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusReply<QVariant>&
QDBusReply<QVariant>::operator=(const QDBusMessage &reply)
{
    QVariant data(QMetaType::fromType<QDBusVariant>());
    qDBusReplyFill(reply, m_error, data);
    m_data = qvariant_cast<QDBusVariant>(data).variant();
    return *this;
}